

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

void __thiscall ncnn::Proposal::Proposal(Proposal *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_fffffffffffffe90;
  Allocator *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  int _w;
  Mat *in_stack_fffffffffffffeb0;
  
  _w = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  Layer::Layer(in_stack_fffffffffffffe90);
  *in_RDI = &PTR__Proposal_01fcba28;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  in_RDI[0x21] = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  *(undefined4 *)((long)in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  *(undefined4 *)(in_RDI + 0x29) = 0;
  in_RDI[0x2a] = 0;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  *(undefined4 *)((long)in_RDI + 0x15c) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)((long)in_RDI + 0x164) = 0;
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  *(undefined4 *)(in_RDI + 0x32) = 0;
  in_RDI[0x33] = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)((long)in_RDI + 0x1a4) = 0;
  *(undefined4 *)(in_RDI + 0x35) = 0;
  *(undefined4 *)((long)in_RDI + 0x1ac) = 0;
  *(undefined4 *)(in_RDI + 0x36) = 0;
  in_RDI[0x37] = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  Mat::create(in_stack_fffffffffffffeb0,_w,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  *(undefined4 *)in_RDI[0x1d] = 0x3f000000;
  *(undefined4 *)(in_RDI[0x1d] + 4) = 0x3f800000;
  *(undefined4 *)(in_RDI[0x1d] + 8) = 0x40000000;
  Mat::create(in_stack_fffffffffffffeb0,_w,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  *(undefined4 *)in_RDI[0x26] = 0x41000000;
  *(undefined4 *)(in_RDI[0x26] + 4) = 0x41800000;
  *(undefined4 *)(in_RDI[0x26] + 8) = 0x42000000;
  return;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}